

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_xar.c
# Opt level: O0

int xar_write_header(archive_write *a,archive_entry *entry)

{
  long lVar1;
  archive_entry *paVar2;
  int iVar3;
  int iVar4;
  mode_t mVar5;
  uint uVar6;
  archive_string_conv *paVar7;
  int *piVar8;
  __off_t _Var9;
  char *pcVar10;
  size_t sVar11;
  file_conflict *pfVar12;
  int algsize;
  int r2;
  int r;
  archive_entry *file_entry;
  file_conflict *file;
  xar_conflict *xar;
  archive_entry *entry_local;
  archive_write *a_local;
  
  file = (file_conflict *)a->format_data;
  file->chnext = (file_conflict *)0x0;
  file->hlnext = (file_conflict *)0x0;
  xar = (xar_conflict *)entry;
  entry_local = (archive_entry *)a;
  if (*(long *)((file->data).a_sum.val + 8) == 0) {
    paVar7 = archive_string_conversion_to_charset((archive_conflict *)a,"UTF-8",L'\x01');
    *(archive_string_conv **)((file->data).a_sum.val + 8) = paVar7;
    if (*(long *)((file->data).a_sum.val + 8) == 0) {
      return -0x1e;
    }
  }
  file_entry = (archive_entry *)file_new((archive_write *)entry_local,(archive_entry *)xar);
  if (file_entry == (archive_entry *)0x0) {
    archive_set_error((archive *)entry_local,0xc,"Can\'t allocate data");
    a_local._4_4_ = -0x1e;
  }
  else {
    iVar3 = file_gen_utility_names((archive_write *)entry_local,(file_conflict *)file_entry);
    a_local._4_4_ = iVar3;
    if (-0x15 < iVar3) {
      if (((file_entry->ae_stat).aest_uid == 0) && ((file_entry->ae_stat).aest_devmajor == 0)) {
        file_free((file_conflict *)file_entry);
      }
      else {
        lVar1 = *(long *)&(file_entry->ae_stat).aest_atime_nsec;
        a_local._4_4_ = file_tree((archive_write *)entry_local,(file_conflict **)&file_entry);
        if ((a_local._4_4_ == 0) &&
           (a_local._4_4_ = iVar3, *(long *)&(file_entry->ae_stat).aest_atime_nsec == lVar1)) {
          if ((int)(file_entry->ae_stat).aest_atime == 0) {
            file_register((xar_conflict *)file,(file_conflict *)file_entry);
          }
          if (((file_entry->ae_gname).aes_utf8.buffer_length & 1) == 0) {
            if (*(int *)(file->rbnode).rb_nodes == -1) {
              (file->rbnode).rb_nodes[1] = (archive_rb_node *)0x0;
              iVar4 = __archive_mktemp((char *)0x0);
              paVar2 = entry_local;
              *(int *)(file->rbnode).rb_nodes = iVar4;
              if (*(int *)(file->rbnode).rb_nodes < 0) {
                piVar8 = __errno_location();
                archive_set_error((archive *)paVar2,*piVar8,"Couldn\'t create temporary file");
                return -0x1e;
              }
              iVar4 = getalgsize((sumalg)(file->parentdir).buffer_length);
              if (0 < iVar4) {
                _Var9 = lseek(*(int *)(file->rbnode).rb_nodes,(long)iVar4,0);
                paVar2 = entry_local;
                if (_Var9 < 0) {
                  piVar8 = __errno_location();
                  archive_set_error((archive *)paVar2,*piVar8,"lseek failed");
                  return -0x1e;
                }
                (file->rbnode).rb_nodes[1] = (archive_rb_node *)(long)iVar4;
              }
            }
            pcVar10 = archive_entry_hardlink
                                (*(archive_entry **)&(file_entry->ae_stat).aest_atime_nsec);
            if ((pcVar10 == (char *)0x0) &&
               (iVar4 = save_xattrs((archive_write *)entry_local,(file_conflict *)file_entry),
               iVar4 != 0)) {
              a_local._4_4_ = -0x1e;
            }
            else {
              mVar5 = archive_entry_filetype
                                (*(archive_entry **)&(file_entry->ae_stat).aest_atime_nsec);
              if (mVar5 == 0x8000) {
                file->chnext = (file_conflict *)file_entry;
                uVar6 = archive_entry_nlink(*(archive_entry **)
                                             &(file_entry->ae_stat).aest_atime_nsec);
                if (1 < uVar6) {
                  iVar4 = file_register_hardlink
                                    ((archive_write *)entry_local,(file_conflict *)file_entry);
                  if (iVar4 != 0) {
                    return iVar4;
                  }
                  pcVar10 = archive_entry_hardlink
                                      (*(archive_entry **)&(file_entry->ae_stat).aest_atime_nsec);
                  if (pcVar10 != (char *)0x0) {
                    archive_entry_unset_size
                              (*(archive_entry **)&(file_entry->ae_stat).aest_atime_nsec);
                    return iVar3;
                  }
                }
                (file_entry->ae_fflags_text).aes_utf8.s = (char *)(file->rbnode).rb_nodes[1];
                sVar11 = archive_entry_size(*(archive_entry **)
                                             &(file_entry->ae_stat).aest_atime_nsec);
                (file_entry->ae_fflags_text).aes_utf8.buffer_length = sVar11;
                *(undefined4 *)&(file_entry->ae_fflags_text).aes_wcs.s =
                     *(undefined4 *)&(file->basename).s;
                pfVar12 = (file_conflict *)
                          archive_entry_size(*(archive_entry **)
                                              &(file_entry->ae_stat).aest_atime_nsec);
                file->hlnext = pfVar12;
                checksum_init((chksumwork_conflict *)&(file->basename).buffer_length,
                              *(sumalg *)((long)&(file->parentdir).buffer_length + 4));
                checksum_init((chksumwork_conflict *)&(file->symlink).buffer_length,
                              *(sumalg *)((long)&(file->parentdir).buffer_length + 4));
                iVar4 = xar_compression_init_encoder((archive_write *)entry_local);
                if (iVar4 != 0) {
                  a_local._4_4_ = iVar4;
                }
              }
            }
          }
        }
      }
    }
  }
  return a_local._4_4_;
}

Assistant:

static int
xar_write_header(struct archive_write *a, struct archive_entry *entry)
{
	struct xar *xar;
	struct file *file;
	struct archive_entry *file_entry;
	int r, r2;

	xar = (struct xar *)a->format_data;
	xar->cur_file = NULL;
	xar->bytes_remaining = 0;

	if (xar->sconv == NULL) {
		xar->sconv = archive_string_conversion_to_charset(
		    &a->archive, "UTF-8", 1);
		if (xar->sconv == NULL)
			return (ARCHIVE_FATAL);
	}

	file = file_new(a, entry);
	if (file == NULL) {
		archive_set_error(&a->archive, ENOMEM,
		    "Can't allocate data");
		return (ARCHIVE_FATAL);
	}
	r2 = file_gen_utility_names(a, file);
	if (r2 < ARCHIVE_WARN)
		return (r2);

	/*
	 * Ignore a path which looks like the top of directory name
	 * since we have already made the root directory of an Xar archive.
	 */
	if (archive_strlen(&(file->parentdir)) == 0 &&
	    archive_strlen(&(file->basename)) == 0) {
		file_free(file);
		return (r2);
	}

	/* Add entry into tree */
	file_entry = file->entry;
	r = file_tree(a, &file);
	if (r != ARCHIVE_OK)
		return (r);
	/* There is the same file in tree and
	 * the current file is older than the file in tree.
	 * So we don't need the current file data anymore. */
	if (file->entry != file_entry)
		return (r2);
	if (file->id == 0)
		file_register(xar, file);

	/* A virtual file, which is a directory, does not have
	 * any contents and we won't store it into a archive
	 * file other than its name. */
	if (file->virtual)
		return (r2);

	/*
	 * Prepare to save the contents of the file.
	 */
	if (xar->temp_fd == -1) {
		int algsize;
		xar->temp_offset = 0;
		xar->temp_fd = __archive_mktemp(NULL);
		if (xar->temp_fd < 0) {
			archive_set_error(&a->archive, errno,
			    "Couldn't create temporary file");
			return (ARCHIVE_FATAL);
		}
		algsize = getalgsize(xar->opt_toc_sumalg);
		if (algsize > 0) {
			if (lseek(xar->temp_fd, algsize, SEEK_SET) < 0) {
				archive_set_error(&(a->archive), errno,
				    "lseek failed");
				return (ARCHIVE_FATAL);
			}
			xar->temp_offset = algsize;
		}
	}

	if (archive_entry_hardlink(file->entry) == NULL) {
		r = save_xattrs(a, file);
		if (r != ARCHIVE_OK)
			return (ARCHIVE_FATAL);
	}

	/* Non regular files contents are unneeded to be saved to
	 * a temporary file. */
	if (archive_entry_filetype(file->entry) != AE_IFREG)
		return (r2);

	/*
	 * Set the current file to cur_file to read its contents.
	 */
	xar->cur_file = file;

	if (archive_entry_nlink(file->entry) > 1) {
		r = file_register_hardlink(a, file);
		if (r != ARCHIVE_OK)
			return (r);
		if (archive_entry_hardlink(file->entry) != NULL) {
			archive_entry_unset_size(file->entry);
			return (r2);
		}
	}

	/* Save a offset of current file in temporary file. */
	file->data.temp_offset = xar->temp_offset;
	file->data.size = archive_entry_size(file->entry);
	file->data.compression = xar->opt_compression;
	xar->bytes_remaining = archive_entry_size(file->entry);
	checksum_init(&(xar->a_sumwrk), xar->opt_sumalg);
	checksum_init(&(xar->e_sumwrk), xar->opt_sumalg);
	r = xar_compression_init_encoder(a);

	if (r != ARCHIVE_OK)
		return (r);
	else
		return (r2);
}